

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O2

REF_STATUS ref_cavity_inspect(REF_CAVITY ref_cavity)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  undefined8 uStack_b0;
  REF_INT nodes [27];
  
  if (ref_cavity == (REF_CAVITY)0x0) {
    uVar1 = 2;
  }
  else {
    printf("node %d\nnface = %d maxface = %d blankface = %d\n",(ulong)(uint)ref_cavity->node,
           (ulong)(uint)ref_cavity->nface,(ulong)(uint)ref_cavity->maxface,
           (ulong)(uint)ref_cavity->blankface);
    lVar3 = 0;
    for (uVar2 = 0; (long)uVar2 < (long)ref_cavity->maxface; uVar2 = uVar2 + 1) {
      printf(" f2n[%d] = ",uVar2 & 0xffffffff);
      for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
        printf(" %d ",(ulong)*(uint *)((long)ref_cavity->f2n + lVar4 * 4 + lVar3));
      }
      putchar(10);
      lVar3 = lVar3 + 0xc;
    }
    uVar1 = ref_list_inspect(ref_cavity->tet_list);
    if (uVar1 == 0) {
      uVar1 = ref_cavity->surf_node;
      if (uVar1 == 0xffffffff) {
        uVar1 = ref_cavity->node;
      }
      printf("seg node %d\nnseg = %d maxseg = %d blankseg = %d\n",(ulong)uVar1,
             (ulong)(uint)ref_cavity->nseg,(ulong)(uint)ref_cavity->maxseg,
             (ulong)(uint)ref_cavity->blankseg);
      lVar3 = 0;
      for (uVar2 = 0; (long)uVar2 < (long)ref_cavity->maxseg; uVar2 = uVar2 + 1) {
        printf(" s2n[%d] = ",uVar2 & 0xffffffff);
        for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
          printf(" %d ",(ulong)*(uint *)((long)ref_cavity->s2n + lVar4 * 4 + lVar3));
        }
        putchar(10);
        lVar3 = lVar3 + 0xc;
      }
      uVar1 = ref_list_inspect(ref_cavity->tri_list);
      if (uVar1 == 0) {
        lVar3 = 0;
        while( true ) {
          if (ref_cavity->tri_list->n <= lVar3) {
            return 0;
          }
          uVar1 = ref_cell_nodes(ref_cavity->ref_grid->cell[3],ref_cavity->tri_list->value[lVar3],
                                 nodes);
          if (uVar1 != 0) break;
          for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
            printf(" %d",(ulong)(uint)nodes[lVar4]);
          }
          putchar(10);
          lVar3 = lVar3 + 1;
        }
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
               0x7f,"ref_cavity_inspect",(ulong)uVar1,"cell");
        return uVar1;
      }
      uStack_b0 = 0x7b;
    }
    else {
      uStack_b0 = 0x71;
    }
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
           uStack_b0,"ref_cavity_inspect",(ulong)uVar1,"insp");
  }
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_cavity_inspect(REF_CAVITY ref_cavity) {
  REF_INT face, node;
  REF_INT item, cell, i, nodes[REF_CELL_MAX_SIZE_PER];

  if (NULL == (void *)ref_cavity) return REF_NULL;

  printf("node %d\nnface = %d maxface = %d blankface = %d\n",
         ref_cavity_node(ref_cavity), ref_cavity_nface(ref_cavity),
         ref_cavity_maxface(ref_cavity), ref_cavity_blankface(ref_cavity));
  for (face = 0; face < ref_cavity_maxface(ref_cavity); face++) {
    printf(" f2n[%d] = ", face);
    for (node = 0; node < 3; node++)
      printf(" %d ", ref_cavity_f2n(ref_cavity, node, face));
    printf("\n");
  }
  RSS(ref_list_inspect(ref_cavity_tet_list(ref_cavity)), "insp");
  printf("seg node %d\nnseg = %d maxseg = %d blankseg = %d\n",
         ref_cavity_seg_node(ref_cavity), ref_cavity_nseg(ref_cavity),
         ref_cavity_maxseg(ref_cavity), ref_cavity_blankseg(ref_cavity));
  for (face = 0; face < ref_cavity_maxseg(ref_cavity); face++) {
    printf(" s2n[%d] = ", face);
    for (node = 0; node < 3; node++)
      printf(" %d ", ref_cavity_s2n(ref_cavity, node, face));
    printf("\n");
  }
  RSS(ref_list_inspect(ref_cavity_tri_list(ref_cavity)), "insp");
  each_ref_list_item(ref_cavity_tri_list(ref_cavity), item) {
    cell = ref_list_value(ref_cavity_tri_list(ref_cavity), item);
    RSS(ref_cell_nodes(ref_grid_tri(ref_cavity_grid(ref_cavity)), cell, nodes),
        "cell");
    for (i = 0; i < 4; i++) printf(" %d", nodes[i]);
    printf("\n");
  }
  return REF_SUCCESS;
}